

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstackedlayout.cpp
# Opt level: O1

void __thiscall QStackedLayout::setCurrentIndex(QStackedLayout *this,int index)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  FocusPolicy FVar6;
  QWidget *pQVar7;
  QWidget *this_00;
  QWidget *this_01;
  QWidget *pQVar8;
  int *piVar9;
  QWidget *pQVar10;
  int iVar11;
  QStackedLayoutPrivate *d;
  long in_FS_OFFSET;
  int local_4c;
  void *local_48;
  int *piStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QLayout).field_0x8;
  iVar11 = index;
  if ((long)*(int *)(lVar1 + 200) < 0) {
    pQVar7 = (QWidget *)0x0;
  }
  else {
    pQVar7 = (QWidget *)
             (**(code **)(**(long **)(*(long *)(lVar1 + 0xb8) + (long)*(int *)(lVar1 + 200) * 8) +
                         0x68))();
  }
  if (index < 0) {
LAB_002f18fd:
    this_00 = (QWidget *)0x0;
  }
  else {
    lVar2 = *(long *)&(this->super_QLayout).field_0x8;
    if (*(ulong *)(lVar2 + 0xc0) <= (ulong)(uint)index) goto LAB_002f18fd;
    this_00 = (QWidget *)
              (**(code **)(**(long **)(*(long *)(lVar2 + 0xb8) + (ulong)(uint)index * 8) + 0x68))();
  }
  if ((this_00 == (QWidget *)0x0) || (this_00 == pQVar7)) goto LAB_002f1a9d;
  this_01 = QLayout::parentWidget(&this->super_QLayout);
  if ((this_01 == (QWidget *)0x0) || ((this_01->data->widget_attributes & 0x400) != 0)) {
    bVar3 = false;
  }
  else {
    iVar11 = 0;
    QWidget::setUpdatesEnabled(this_01,false);
    bVar3 = true;
  }
  if (this_01 == (QWidget *)0x0) {
    pQVar8 = (QWidget *)0x0;
  }
  else {
    pQVar8 = QWidget::window(this_01);
    pQVar8 = QWidget::focusWidget(pQVar8);
  }
  if (pQVar8 == (QWidget *)0x0) {
    piVar9 = (int *)0x0;
  }
  else {
    piVar9 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef(&pQVar8->super_QObject);
  }
  if (piVar9 == (int *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = pQVar8 != (QWidget *)0x0 && piVar9[1] != 0;
  }
  bVar5 = true;
  if ((pQVar7 != (QWidget *)0x0) && (bVar4)) {
    if (piVar9 == (int *)0x0) {
      pQVar10 = (QWidget *)0x0;
    }
    else {
      pQVar10 = (QWidget *)0x0;
      if (piVar9[1] != 0) {
        pQVar10 = pQVar8;
      }
    }
    bVar5 = QWidget::isAncestorOf(pQVar7,pQVar10);
    iVar11 = (int)pQVar10;
    bVar5 = !bVar5;
  }
  if ((pQVar7 != (QWidget *)0x0) && (QWidget::clearFocus(pQVar7), *(int *)(lVar1 + 0xcc) == 0)) {
    QWidget::hide(pQVar7);
  }
  *(int *)(lVar1 + 200) = index;
  QWidget::raise(this_00,iVar11);
  QWidget::show(this_00);
  if (!(bool)(this_01 == (QWidget *)0x0 | bVar5)) {
    pQVar7 = QWidget::focusWidget(this_00);
    if (pQVar7 == (QWidget *)0x0) {
      if (piVar9 == (int *)0x0) {
        pQVar10 = (QWidget *)0x0;
      }
      else {
        pQVar10 = (QWidget *)0x0;
        if (piVar9[1] != 0) {
          pQVar10 = pQVar8;
        }
      }
      if (pQVar10 != (QWidget *)0x0) {
        do {
          pQVar10 = QWidget::nextInFocusChain(pQVar10);
          if (piVar9 == (int *)0x0) {
            pQVar7 = (QWidget *)0x0;
          }
          else {
            pQVar7 = pQVar8;
            if (piVar9[1] == 0) {
              pQVar7 = (QWidget *)0x0;
            }
          }
          if (pQVar7 == pQVar10) goto LAB_002f1b57;
          FVar6 = QWidget::focusPolicy(pQVar10);
        } while (((((FVar6 & TabFocus) == NoFocus) ||
                  (pQVar7 = QWidget::focusProxy(pQVar10), pQVar7 != (QWidget *)0x0)) ||
                 (bVar4 = QWidget::isVisibleTo(pQVar10,this_00), !bVar4)) ||
                (((pQVar10->data->widget_attributes & 1) != 0 ||
                 (bVar4 = QWidget::isAncestorOf(this_00,pQVar10), !bVar4))));
        QWidget::setFocus(pQVar10,OtherFocusReason);
LAB_002f1b57:
        if (piVar9 == (int *)0x0) {
          pQVar8 = (QWidget *)0x0;
        }
        else if (piVar9[1] == 0) {
          pQVar8 = (QWidget *)0x0;
        }
        pQVar7 = this_00;
        if (pQVar8 == pQVar10) goto LAB_002f1a2e;
      }
    }
    else {
LAB_002f1a2e:
      QWidget::setFocus(pQVar7,OtherFocusReason);
    }
  }
  if (bVar3) {
    QWidget::setUpdatesEnabled(this_01,true);
  }
  piStack_40 = &local_4c;
  local_48 = (void *)0x0;
  local_4c = index;
  QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_48);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      operator_delete(piVar9);
    }
  }
LAB_002f1a9d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStackedLayout::setCurrentIndex(int index)
{
    Q_D(QStackedLayout);
    QWidget *prev = currentWidget();
    QWidget *next = widget(index);
    if (!next || next == prev)
        return;

    bool reenableUpdates = false;
    QWidget *parent = parentWidget();

    if (parent && parent->updatesEnabled()) {
        reenableUpdates = true;
        parent->setUpdatesEnabled(false);
    }

    QPointer<QWidget> fw = parent ? parent->window()->focusWidget() : nullptr;
    const bool focusWasOnOldPage = fw && (prev && prev->isAncestorOf(fw));

    if (prev) {
        prev->clearFocus();
        if (d->stackingMode == StackOne)
            prev->hide();
    }

    d->index = index;
    next->raise();
    next->show();

    // try to move focus onto the incoming widget if focus
    // was somewhere on the outgoing widget.

    if (parent) {
        if (focusWasOnOldPage) {
            // look for the best focus widget we can find
            if (QWidget *nfw = next->focusWidget())
                nfw->setFocus();
            else {
                // second best: first child widget in the focus chain
                if (QWidget *i = fw) {
                    while ((i = i->nextInFocusChain()) != fw) {
                        if (((i->focusPolicy() & Qt::TabFocus) == Qt::TabFocus)
                            && !i->focusProxy() && i->isVisibleTo(next) && i->isEnabled()
                            && next->isAncestorOf(i)) {
                            i->setFocus();
                            break;
                        }
                    }
                    // third best: incoming widget
                    if (i == fw )
                        next->setFocus();
                }
            }
        }
    }
    if (reenableUpdates)
        parent->setUpdatesEnabled(true);
    emit currentChanged(index);
}